

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

Gia_Man_t * Gia_QbfQuantifyOne(Gia_Man_t *p,int iVar,int fAndAll,int fOrAll)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar7;
  int iVar8;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  iVar8 = 0;
  do {
    iVar2 = p->nRegs;
    if (p->vCis->nSize - iVar2 <= iVar8) {
LAB_00617bc9:
      p_01 = Vec_IntAlloc((p->vCos->nSize - iVar2) * 2);
      uVar1 = 0;
      do {
        if (uVar1 == 2) {
          if (fAndAll == 0) {
            if (fOrAll == 0) {
              iVar8 = p_01->nSize;
              iVar2 = 0;
              if (iVar8 < 1) {
                iVar8 = 0;
              }
              for (; iVar8 != iVar2; iVar2 = iVar2 + 1) {
                iVar3 = Vec_IntEntry(p_01,iVar2);
                Gia_ManAppendCo(p_00,iVar3);
              }
            }
            else {
              for (iVar8 = 0; iVar8 < p->vCos->nSize - p->nRegs; iVar8 = iVar8 + 1) {
                iVar2 = Vec_IntEntry(p_01,iVar8);
                iVar3 = Vec_IntEntry(p_01,(p->vCos->nSize - p->nRegs) + iVar8);
                iVar2 = Gia_ManHashOr(p_00,iVar2,iVar3);
                Gia_ManAppendCo(p_00,iVar2);
              }
            }
          }
          else {
            for (iVar8 = 0; iVar8 < p->vCos->nSize - p->nRegs; iVar8 = iVar8 + 1) {
              iVar2 = Vec_IntEntry(p_01,iVar8);
              iVar3 = Vec_IntEntry(p_01,(p->vCos->nSize - p->nRegs) + iVar8);
              iVar2 = Gia_ManHashAnd(p_00,iVar2,iVar3);
              Gia_ManAppendCo(p_00,iVar2);
            }
          }
          Vec_IntFree(p_01);
          pGVar7 = Gia_ManCleanup(p_00);
          Gia_ManStop(p_00);
          return pGVar7;
        }
        if (p->vCis->nSize - p->nRegs <= iVar) {
          __assert_fail("v < Gia_ManPiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
        }
        pGVar6 = Gia_ManCi(p,iVar);
        pGVar6->Value = uVar1;
        for (iVar8 = 0; iVar8 < p->nObjs; iVar8 = iVar8 + 1) {
          pGVar6 = Gia_ManObj(p,iVar8);
          if (pGVar6 == (Gia_Obj_t *)0x0) break;
          if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
            iVar2 = Gia_ObjFanin0Copy(pGVar6);
            iVar3 = Gia_ObjFanin1Copy(pGVar6);
            uVar4 = Gia_ManHashAnd(p_00,iVar2,iVar3);
            pGVar6->Value = uVar4;
          }
        }
        for (iVar8 = 0; iVar8 < p->vCos->nSize - p->nRegs; iVar8 = iVar8 + 1) {
          pGVar6 = Gia_ManCo(p,iVar8);
          if (pGVar6 == (Gia_Obj_t *)0x0) break;
          iVar2 = Gia_ObjFanin0Copy(pGVar6);
          Vec_IntPush(p_01,iVar2);
        }
        uVar1 = uVar1 + 1;
      } while( true );
    }
    pGVar6 = Gia_ManCi(p,iVar8);
    if (pGVar6 == (Gia_Obj_t *)0x0) {
      iVar2 = p->nRegs;
      goto LAB_00617bc9;
    }
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar6->Value = uVar1;
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_QbfQuantifyOne( Gia_Man_t * p, int iVar, int fAndAll, int fOrAll )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCofs;
    int i, c;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // compute cofactors
    vCofs = Vec_IntAlloc( 2 * Gia_ManPoNum(p) );
    for ( c = 0; c < 2; c++ )
    {
        Gia_ManPi(p, iVar)->Value = c;
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachPo( p, pObj, i )
            Vec_IntPush( vCofs, Gia_ObjFanin0Copy(pObj) );
    }
    if ( fAndAll )
    {
        for ( i = 0; i < Gia_ManPoNum(p); i++ )
            Gia_ManAppendCo( pNew, Gia_ManHashAnd(pNew, Vec_IntEntry(vCofs, i), Vec_IntEntry(vCofs, Gia_ManPoNum(p)+i)) );
    }
    else if ( fOrAll )
    {
        for ( i = 0; i < Gia_ManPoNum(p); i++ )
            Gia_ManAppendCo( pNew, Gia_ManHashOr(pNew, Vec_IntEntry(vCofs, i), Vec_IntEntry(vCofs, Gia_ManPoNum(p)+i)) );
    }
    else
    {
        Vec_IntForEachEntry( vCofs, c, i )
            Gia_ManAppendCo( pNew, c );
    }
    Vec_IntFree( vCofs );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}